

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  StackItemT<embree::NodeRefPtr<4>_> SVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  long lVar10;
  Precalculations *pPVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar14;
  int iVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  UVIdentity<4> *pUVar19;
  long lVar20;
  RayHitK<4> *pRVar21;
  float *vertices;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [16];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [16];
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1310;
  vbool<4> valid;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 *local_1268;
  ulong local_1260;
  ulong local_1258;
  ulong local_1250;
  ulong local_1248;
  ulong local_1240;
  RayHitK<4> *local_1238;
  long local_1230;
  Scene *scene;
  long local_1220;
  RTCFilterFunctionNArguments args;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  vfloat<4> tNear;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1078;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1310 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1098._4_4_ = uVar28;
  local_1098._0_4_ = uVar28;
  local_1098._8_4_ = uVar28;
  local_1098._12_4_ = uVar28;
  auVar96 = ZEXT1664(local_1098);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10a8._4_4_ = uVar28;
  local_10a8._0_4_ = uVar28;
  local_10a8._8_4_ = uVar28;
  local_10a8._12_4_ = uVar28;
  auVar97 = ZEXT1664(local_10a8);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10b8._4_4_ = uVar28;
  local_10b8._0_4_ = uVar28;
  local_10b8._8_4_ = uVar28;
  local_10b8._12_4_ = uVar28;
  auVar103 = ZEXT1664(local_10b8);
  local_10f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1108 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_10c8 = local_10f8 * 0.99999964;
  local_10d8 = local_1108 * 0.99999964;
  local_10e8 = local_1118 * 0.99999964;
  local_10f8 = local_10f8 * 1.0000004;
  local_1108 = local_1108 * 1.0000004;
  local_1118 = local_1118 * 1.0000004;
  local_1240 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1248 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1250 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1258 = local_1240 ^ 0x10;
  local_1260 = local_1248 ^ 0x10;
  uVar22 = local_1250 ^ 0x10;
  iVar15 = (tray->tnear).field_0.i[k];
  auVar80._4_4_ = iVar15;
  auVar80._0_4_ = iVar15;
  auVar80._8_4_ = iVar15;
  auVar80._12_4_ = iVar15;
  iVar15 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT1664(CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15))));
  local_1268 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  uVar26 = local_1260;
  uVar18 = local_1240;
  uVar23 = local_1248;
  uVar24 = local_1250;
  uVar27 = local_1258;
  fVar104 = local_10c8;
  fVar106 = local_10c8;
  fVar107 = local_10c8;
  fVar108 = local_10c8;
  fVar109 = local_10d8;
  fVar111 = local_10d8;
  fVar112 = local_10d8;
  fVar113 = local_10d8;
  fVar114 = local_10e8;
  fVar116 = local_10e8;
  fVar117 = local_10e8;
  fVar118 = local_10e8;
  fVar119 = local_10f8;
  fVar128 = local_10f8;
  fVar131 = local_10f8;
  fVar133 = local_10f8;
  fVar135 = local_1108;
  fVar124 = local_1108;
  fVar125 = local_1108;
  fVar126 = local_1108;
  fVar127 = local_1118;
  fVar130 = local_1118;
  fVar132 = local_1118;
  fVar134 = local_1118;
  local_1238 = ray;
  do {
    do {
      do {
        if (local_1310 == stack) {
          return;
        }
        pSVar14 = local_1310 + -1;
        local_1310 = local_1310 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar14->dist);
      sVar25 = (local_1310->ptr).ptr;
      do {
        if ((sVar25 & 8) == 0) {
          uVar16 = sVar25 & 0xfffffffffffffff0;
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar44._4_4_ = uVar28;
          auVar44._0_4_ = uVar28;
          auVar44._8_4_ = uVar28;
          auVar44._12_4_ = uVar28;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar18),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar18));
          auVar45 = vsubps_avx(auVar45,auVar96._0_16_);
          auVar54._0_4_ = fVar104 * auVar45._0_4_;
          auVar54._4_4_ = fVar106 * auVar45._4_4_;
          auVar54._8_4_ = fVar107 * auVar45._8_4_;
          auVar54._12_4_ = fVar108 * auVar45._12_4_;
          auVar45 = vmaxps_avx(auVar80,auVar54);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar23),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar23));
          auVar54 = vsubps_avx(auVar54,auVar97._0_16_);
          auVar59._0_4_ = fVar109 * auVar54._0_4_;
          auVar59._4_4_ = fVar111 * auVar54._4_4_;
          auVar59._8_4_ = fVar112 * auVar54._8_4_;
          auVar59._12_4_ = fVar113 * auVar54._12_4_;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar24),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar24));
          auVar54 = vsubps_avx(auVar54,auVar103._0_16_);
          auVar65._0_4_ = fVar114 * auVar54._0_4_;
          auVar65._4_4_ = fVar116 * auVar54._4_4_;
          auVar65._8_4_ = fVar117 * auVar54._8_4_;
          auVar65._12_4_ = fVar118 * auVar54._12_4_;
          auVar54 = vmaxps_avx(auVar59,auVar65);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar45,auVar54)
          ;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar27),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar27));
          auVar45 = vsubps_avx(auVar45,auVar96._0_16_);
          auVar60._0_4_ = fVar119 * auVar45._0_4_;
          auVar60._4_4_ = fVar128 * auVar45._4_4_;
          auVar60._8_4_ = fVar131 * auVar45._8_4_;
          auVar60._12_4_ = fVar133 * auVar45._12_4_;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar26),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar26));
          auVar45 = vsubps_avx(auVar45,auVar97._0_16_);
          auVar66._0_4_ = fVar135 * auVar45._0_4_;
          auVar66._4_4_ = fVar124 * auVar45._4_4_;
          auVar66._8_4_ = fVar125 * auVar45._8_4_;
          auVar66._12_4_ = fVar126 * auVar45._12_4_;
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar22),auVar44,
                                    *(undefined1 (*) [16])(uVar16 + 0x20 + uVar22));
          auVar45 = vsubps_avx(auVar45,auVar103._0_16_);
          auVar74._0_4_ = fVar127 * auVar45._0_4_;
          auVar74._4_4_ = fVar130 * auVar45._4_4_;
          auVar74._8_4_ = fVar132 * auVar45._8_4_;
          auVar74._12_4_ = fVar134 * auVar45._12_4_;
          auVar45 = vminps_avx(auVar66,auVar74);
          auVar54 = vminps_avx(auVar43._0_16_,auVar60);
          auVar45 = vminps_avx(auVar54,auVar45);
          if (((uint)sVar25 & 7) == 6) {
            auVar54 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar45,2);
            auVar45 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar44,2);
            auVar44 = vcmpps_avx(auVar44,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
            auVar45 = vandps_avx(auVar45,auVar44);
            auVar45 = vandps_avx(auVar45,auVar54);
          }
          else {
            auVar45 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar45,2);
          }
          auVar45 = vpslld_avx(auVar45,0x1f);
          uVar28 = vmovmskps_avx(auVar45);
          pre = (Precalculations *)CONCAT44((int)((ulong)pre >> 0x20),uVar28);
        }
        if ((sVar25 & 8) == 0) {
          if (pre == (Precalculations *)0x0) {
            iVar15 = 4;
          }
          else {
            uVar16 = sVar25 & 0xfffffffffffffff0;
            lVar10 = 0;
            for (pPVar11 = pre; ((ulong)pPVar11 & 1) == 0;
                pPVar11 = (Precalculations *)((ulong)pPVar11 >> 1 | 0x8000000000000000)) {
              lVar10 = lVar10 + 1;
            }
            iVar15 = 0;
            uVar29 = (ulong)(pre + -1) & (ulong)pre;
            sVar25 = *(ulong *)(uVar16 + lVar10 * 8);
            if (uVar29 != 0) {
              uVar4 = tNear.field_0.i[lVar10];
              lVar10 = 0;
              for (uVar30 = uVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              uVar29 = uVar29 - 1 & uVar29;
              uVar30 = *(ulong *)(uVar16 + lVar10 * 8);
              uVar3 = tNear.field_0.i[lVar10];
              if (uVar29 == 0) {
                if (uVar4 < uVar3) {
                  (local_1310->ptr).ptr = uVar30;
                  local_1310->dist = uVar3;
                  local_1310 = local_1310 + 1;
                }
                else {
                  (local_1310->ptr).ptr = sVar25;
                  local_1310->dist = uVar4;
                  sVar25 = uVar30;
                  local_1310 = local_1310 + 1;
                }
              }
              else {
                auVar45._8_8_ = 0;
                auVar45._0_8_ = sVar25;
                auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar4));
                auVar55._8_8_ = 0;
                auVar55._0_8_ = uVar30;
                auVar54 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar3));
                lVar10 = 0;
                for (uVar30 = uVar29; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
                {
                  lVar10 = lVar10 + 1;
                }
                uVar29 = uVar29 - 1 & uVar29;
                auVar61._8_8_ = 0;
                auVar61._0_8_ = *(ulong *)(uVar16 + lVar10 * 8);
                auVar59 = vpunpcklqdq_avx(auVar61,ZEXT416((uint)tNear.field_0.i[lVar10]));
                auVar44 = vpcmpgtd_avx(auVar54,auVar45);
                if (uVar29 == 0) {
                  auVar60 = vpshufd_avx(auVar44,0xaa);
                  auVar44 = vblendvps_avx(auVar54,auVar45,auVar60);
                  auVar45 = vblendvps_avx(auVar45,auVar54,auVar60);
                  auVar54 = vpcmpgtd_avx(auVar59,auVar44);
                  auVar60 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar59,auVar44,auVar60);
                  auVar44 = vblendvps_avx(auVar44,auVar59,auVar60);
                  auVar59 = vpcmpgtd_avx(auVar44,auVar45);
                  auVar59 = vpshufd_avx(auVar59,0xaa);
                  SVar7 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar44,auVar45,auVar59)
                  ;
                  SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar44,auVar59)
                  ;
                  *local_1310 = SVar8;
                  local_1310[1] = SVar7;
                  sVar25 = auVar54._0_8_;
                  local_1310 = local_1310 + 2;
                }
                else {
                  lVar10 = 0;
                  for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                    lVar10 = lVar10 + 1;
                  }
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = *(ulong *)(uVar16 + lVar10 * 8);
                  auVar65 = vpunpcklqdq_avx(auVar75,ZEXT416((uint)tNear.field_0.i[lVar10]));
                  auVar60 = vpshufd_avx(auVar44,0xaa);
                  auVar44 = vblendvps_avx(auVar54,auVar45,auVar60);
                  auVar45 = vblendvps_avx(auVar45,auVar54,auVar60);
                  auVar54 = vpcmpgtd_avx(auVar65,auVar59);
                  auVar60 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar65,auVar59,auVar60);
                  auVar59 = vblendvps_avx(auVar59,auVar65,auVar60);
                  auVar60 = vpcmpgtd_avx(auVar59,auVar45);
                  auVar65 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar59,auVar45,auVar65);
                  SVar7 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar59,auVar65)
                  ;
                  auVar45 = vpcmpgtd_avx(auVar54,auVar44);
                  auVar59 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar54,auVar44,auVar59);
                  auVar54 = vblendvps_avx(auVar44,auVar54,auVar59);
                  auVar44 = vpcmpgtd_avx(auVar60,auVar54);
                  auVar44 = vpshufd_avx(auVar44,0xaa);
                  SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar60,auVar54,auVar44)
                  ;
                  SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar54,auVar60,auVar44)
                  ;
                  *local_1310 = SVar7;
                  local_1310[1] = SVar9;
                  local_1310[2] = SVar8;
                  sVar25 = auVar45._0_8_;
                  local_1310 = local_1310 + 3;
                }
              }
            }
          }
        }
        else {
          iVar15 = 6;
        }
      } while (iVar15 == 0);
    } while (iVar15 != 6);
    local_1230 = (ulong)((uint)sVar25 & 0xf) - 8;
    if (local_1230 != 0) {
      uVar26 = sVar25 & 0xfffffffffffffff0;
      local_1220 = 0;
      pRVar21 = ray;
      do {
        ray = local_1238;
        lVar17 = local_1220 * 0x50;
        pSVar5 = context->scene;
        pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar26 + 0x30 + lVar17)].ptr;
        fVar104 = (pGVar6->time_range).lower;
        fVar104 = pGVar6->fnumTimeSegments *
                  ((*(float *)(pRVar21 + k * 4 + 0x70) - fVar104) /
                  ((pGVar6->time_range).upper - fVar104));
        auVar45 = vroundss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),9);
        auVar45 = vminss_avx(auVar45,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
        auVar36 = vmaxss_avx(ZEXT816(0),auVar45);
        lVar20 = (long)(int)auVar36._0_4_ * 0x38;
        uVar32 = (ulong)*(uint *)(uVar26 + 4 + lVar17);
        lVar10 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar20);
        lVar20 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar20);
        auVar45 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar26 + lVar17) * 4);
        uVar33 = (ulong)*(uint *)(uVar26 + 0x10 + lVar17);
        auVar54 = *(undefined1 (*) [16])(lVar10 + uVar33 * 4);
        uVar23 = (ulong)*(uint *)(uVar26 + 0x20 + lVar17);
        auVar47 = *(undefined1 (*) [16])(lVar10 + uVar23 * 4);
        auVar44 = *(undefined1 (*) [16])(lVar10 + uVar32 * 4);
        uVar27 = (ulong)*(uint *)(uVar26 + 0x14 + lVar17);
        auVar59 = *(undefined1 (*) [16])(lVar10 + uVar27 * 4);
        uVar24 = (ulong)*(uint *)(uVar26 + 0x24 + lVar17);
        auVar48 = *(undefined1 (*) [16])(lVar10 + uVar24 * 4);
        uVar18 = (ulong)*(uint *)(uVar26 + 8 + lVar17);
        auVar60 = *(undefined1 (*) [16])(lVar10 + uVar18 * 4);
        uVar30 = (ulong)*(uint *)(uVar26 + 0x18 + lVar17);
        auVar65 = *(undefined1 (*) [16])(lVar10 + uVar30 * 4);
        uVar16 = (ulong)*(uint *)(uVar26 + 0x28 + lVar17);
        auVar66 = *(undefined1 (*) [16])(lVar10 + uVar16 * 4);
        uVar34 = (ulong)*(uint *)(uVar26 + 0xc + lVar17);
        auVar74 = *(undefined1 (*) [16])(lVar10 + uVar34 * 4);
        uVar31 = (ulong)*(uint *)(uVar26 + 0x1c + lVar17);
        auVar55 = *(undefined1 (*) [16])(lVar10 + uVar31 * 4);
        uVar29 = (ulong)*(uint *)(uVar26 + 0x2c + lVar17);
        auVar61 = *(undefined1 (*) [16])(lVar10 + uVar29 * 4);
        auVar75 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar26 + lVar17) * 4);
        auVar64 = *(undefined1 (*) [16])(lVar20 + uVar33 * 4);
        fVar104 = fVar104 - auVar36._0_4_;
        auVar36 = vunpcklps_avx(auVar45,auVar60);
        auVar60 = vunpckhps_avx(auVar45,auVar60);
        auVar37 = vunpcklps_avx(auVar44,auVar74);
        auVar44 = vunpckhps_avx(auVar44,auVar74);
        auVar45 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
        auVar35 = vunpcklps_avx(auVar60,auVar44);
        auVar38 = vunpcklps_avx(auVar36,auVar37);
        auVar60 = vunpckhps_avx(auVar36,auVar37);
        auVar74 = vunpcklps_avx(auVar54,auVar65);
        auVar44 = vunpckhps_avx(auVar54,auVar65);
        auVar65 = vunpcklps_avx(auVar59,auVar55);
        auVar59 = vunpckhps_avx(auVar59,auVar55);
        auVar54 = *(undefined1 (*) [16])(lVar20 + uVar18 * 4);
        auVar55 = vunpcklps_avx(auVar44,auVar59);
        auVar36 = vunpcklps_avx(auVar74,auVar65);
        auVar59 = vunpckhps_avx(auVar74,auVar65);
        auVar74 = vunpcklps_avx(auVar47,auVar66);
        auVar65 = vunpckhps_avx(auVar47,auVar66);
        auVar37 = vunpcklps_avx(auVar48,auVar61);
        auVar66 = vunpckhps_avx(auVar48,auVar61);
        auVar44 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
        auVar61 = vunpcklps_avx(auVar65,auVar66);
        auVar47 = vunpcklps_avx(auVar74,auVar37);
        auVar65 = vunpckhps_avx(auVar74,auVar37);
        auVar66 = vunpcklps_avx(auVar75,auVar54);
        auVar54 = vunpckhps_avx(auVar75,auVar54);
        auVar74 = vunpcklps_avx(auVar45,auVar44);
        auVar44 = vunpckhps_avx(auVar45,auVar44);
        auVar45 = *(undefined1 (*) [16])(lVar20 + uVar30 * 4);
        auVar75 = vunpcklps_avx(auVar54,auVar44);
        auVar37 = vunpcklps_avx(auVar66,auVar74);
        auVar44 = vunpckhps_avx(auVar66,auVar74);
        auVar74 = vunpcklps_avx(auVar64,auVar45);
        auVar66 = vunpckhps_avx(auVar64,auVar45);
        auVar45 = *(undefined1 (*) [16])(lVar20 + uVar27 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar20 + uVar31 * 4);
        auVar64 = vunpcklps_avx(auVar45,auVar54);
        auVar45 = vunpckhps_avx(auVar45,auVar54);
        auVar48 = vunpcklps_avx(auVar66,auVar45);
        auVar46 = vunpcklps_avx(auVar74,auVar64);
        auVar66 = vunpckhps_avx(auVar74,auVar64);
        auVar45 = *(undefined1 (*) [16])(lVar20 + uVar23 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar20 + uVar16 * 4);
        auVar64 = vunpcklps_avx(auVar45,auVar54);
        auVar74 = vunpckhps_avx(auVar45,auVar54);
        auVar45 = *(undefined1 (*) [16])(lVar20 + uVar24 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar20 + uVar29 * 4);
        auVar56 = vunpcklps_avx(auVar45,auVar54);
        auVar45 = vunpckhps_avx(auVar45,auVar54);
        auVar54 = vunpcklps_avx(auVar74,auVar45);
        auVar74 = vunpcklps_avx(auVar64,auVar56);
        auVar45 = vunpckhps_avx(auVar64,auVar56);
        fVar106 = 1.0 - fVar104;
        auVar115._4_4_ = fVar106;
        auVar115._0_4_ = fVar106;
        auVar115._8_4_ = fVar106;
        auVar115._12_4_ = fVar106;
        auVar81._0_4_ = fVar104 * auVar37._0_4_;
        auVar81._4_4_ = fVar104 * auVar37._4_4_;
        auVar81._8_4_ = fVar104 * auVar37._8_4_;
        auVar81._12_4_ = fVar104 * auVar37._12_4_;
        auVar64 = vfmadd231ps_fma(auVar81,auVar115,auVar38);
        auVar98._0_4_ = fVar104 * auVar44._0_4_;
        auVar98._4_4_ = fVar104 * auVar44._4_4_;
        auVar98._8_4_ = fVar104 * auVar44._8_4_;
        auVar98._12_4_ = fVar104 * auVar44._12_4_;
        auVar60 = vfmadd231ps_fma(auVar98,auVar115,auVar60);
        auVar89._0_4_ = fVar104 * auVar75._0_4_;
        auVar89._4_4_ = fVar104 * auVar75._4_4_;
        auVar89._8_4_ = fVar104 * auVar75._8_4_;
        auVar89._12_4_ = fVar104 * auVar75._12_4_;
        auVar75 = vfmadd231ps_fma(auVar89,auVar115,auVar35);
        auVar76._0_4_ = fVar104 * auVar46._0_4_;
        auVar76._4_4_ = fVar104 * auVar46._4_4_;
        auVar76._8_4_ = fVar104 * auVar46._8_4_;
        auVar76._12_4_ = fVar104 * auVar46._12_4_;
        auVar36 = vfmadd231ps_fma(auVar76,auVar115,auVar36);
        auVar67._0_4_ = fVar104 * auVar66._0_4_;
        auVar67._4_4_ = fVar104 * auVar66._4_4_;
        auVar67._8_4_ = fVar104 * auVar66._8_4_;
        auVar67._12_4_ = fVar104 * auVar66._12_4_;
        auVar66 = vfmadd231ps_fma(auVar67,auVar115,auVar59);
        puVar1 = (undefined8 *)(uVar26 + 0x30 + lVar17);
        local_1018 = *puVar1;
        uStack_1010 = puVar1[1];
        puVar1 = (undefined8 *)(uVar26 + 0x40 + lVar17);
        auVar46._0_4_ = fVar104 * auVar48._0_4_;
        auVar46._4_4_ = fVar104 * auVar48._4_4_;
        auVar46._8_4_ = fVar104 * auVar48._8_4_;
        auVar46._12_4_ = fVar104 * auVar48._12_4_;
        auVar55 = vfmadd231ps_fma(auVar46,auVar115,auVar55);
        auVar56._0_4_ = fVar104 * auVar74._0_4_;
        auVar56._4_4_ = fVar104 * auVar74._4_4_;
        auVar56._8_4_ = fVar104 * auVar74._8_4_;
        auVar56._12_4_ = fVar104 * auVar74._12_4_;
        auVar62._0_4_ = fVar104 * auVar45._0_4_;
        auVar62._4_4_ = fVar104 * auVar45._4_4_;
        auVar62._8_4_ = fVar104 * auVar45._8_4_;
        auVar62._12_4_ = fVar104 * auVar45._12_4_;
        auVar105._0_4_ = fVar104 * auVar54._0_4_;
        auVar105._4_4_ = fVar104 * auVar54._4_4_;
        auVar105._8_4_ = fVar104 * auVar54._8_4_;
        auVar105._12_4_ = fVar104 * auVar54._12_4_;
        auVar74 = vfmadd231ps_fma(auVar56,auVar115,auVar47);
        auVar37 = vfmadd231ps_fma(auVar62,auVar115,auVar65);
        auVar61 = vfmadd231ps_fma(auVar105,auVar115,auVar61);
        local_11d8 = *puVar1;
        uStack_11d0 = puVar1[1];
        pUVar19 = &mapUV;
        uVar28 = *(undefined4 *)(local_1238 + k * 4);
        auVar35._4_4_ = uVar28;
        auVar35._0_4_ = uVar28;
        auVar35._8_4_ = uVar28;
        auVar35._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x10);
        auVar120._4_4_ = uVar28;
        auVar120._0_4_ = uVar28;
        auVar120._8_4_ = uVar28;
        auVar120._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x20);
        auVar122._4_4_ = uVar28;
        auVar122._0_4_ = uVar28;
        auVar122._8_4_ = uVar28;
        auVar122._12_4_ = uVar28;
        auVar44 = vsubps_avx(auVar64,auVar35);
        auVar59 = vsubps_avx(auVar60,auVar120);
        auVar45 = vsubps_avx(auVar75,auVar122);
        auVar54 = vsubps_avx(auVar36,auVar35);
        auVar60 = vsubps_avx(auVar66,auVar120);
        auVar65 = vsubps_avx(auVar55,auVar122);
        auVar66 = vsubps_avx(auVar74,auVar35);
        auVar74 = vsubps_avx(auVar37,auVar120);
        auVar55 = vsubps_avx(auVar61,auVar122);
        auVar61 = vsubps_avx(auVar66,auVar44);
        local_1038 = vsubps_avx(auVar74,auVar59);
        local_1028 = vsubps_avx(auVar55,auVar45);
        auVar36._0_4_ = auVar66._0_4_ + auVar44._0_4_;
        auVar36._4_4_ = auVar66._4_4_ + auVar44._4_4_;
        auVar36._8_4_ = auVar66._8_4_ + auVar44._8_4_;
        auVar36._12_4_ = auVar66._12_4_ + auVar44._12_4_;
        auVar63._0_4_ = auVar74._0_4_ + auVar59._0_4_;
        auVar63._4_4_ = auVar74._4_4_ + auVar59._4_4_;
        auVar63._8_4_ = auVar74._8_4_ + auVar59._8_4_;
        auVar63._12_4_ = auVar74._12_4_ + auVar59._12_4_;
        fVar106 = auVar45._0_4_;
        auVar68._0_4_ = auVar55._0_4_ + fVar106;
        fVar107 = auVar45._4_4_;
        auVar68._4_4_ = auVar55._4_4_ + fVar107;
        fVar108 = auVar45._8_4_;
        auVar68._8_4_ = auVar55._8_4_ + fVar108;
        fVar109 = auVar45._12_4_;
        auVar68._12_4_ = auVar55._12_4_ + fVar109;
        auVar121._0_4_ = local_1028._0_4_ * auVar63._0_4_;
        auVar121._4_4_ = local_1028._4_4_ * auVar63._4_4_;
        auVar121._8_4_ = local_1028._8_4_ * auVar63._8_4_;
        auVar121._12_4_ = local_1028._12_4_ * auVar63._12_4_;
        auVar64 = vfmsub231ps_fma(auVar121,local_1038,auVar68);
        auVar69._0_4_ = auVar61._0_4_ * auVar68._0_4_;
        auVar69._4_4_ = auVar61._4_4_ * auVar68._4_4_;
        auVar69._8_4_ = auVar61._8_4_ * auVar68._8_4_;
        auVar69._12_4_ = auVar61._12_4_ * auVar68._12_4_;
        auVar75 = vfmsub231ps_fma(auVar69,local_1028,auVar36);
        auVar37._0_4_ = local_1038._0_4_ * auVar36._0_4_;
        auVar37._4_4_ = local_1038._4_4_ * auVar36._4_4_;
        auVar37._8_4_ = local_1038._8_4_ * auVar36._8_4_;
        auVar37._12_4_ = local_1038._12_4_ * auVar36._12_4_;
        auVar36 = vfmsub231ps_fma(auVar37,auVar61,auVar63);
        fVar104 = *(float *)(local_1238 + k * 4 + 0x60);
        auVar57._0_4_ = fVar104 * auVar36._0_4_;
        auVar57._4_4_ = fVar104 * auVar36._4_4_;
        auVar57._8_4_ = fVar104 * auVar36._8_4_;
        auVar57._12_4_ = fVar104 * auVar36._12_4_;
        uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x50);
        auVar99._4_4_ = uVar28;
        auVar99._0_4_ = uVar28;
        auVar99._8_4_ = uVar28;
        auVar99._12_4_ = uVar28;
        auVar75 = vfmadd231ps_fma(auVar57,auVar99,auVar75);
        uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x40);
        auVar123._4_4_ = uVar28;
        auVar123._0_4_ = uVar28;
        auVar123._8_4_ = uVar28;
        auVar123._12_4_ = uVar28;
        local_1078 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar75,auVar123,auVar64);
        local_1048 = vsubps_avx(auVar59,auVar60);
        local_1068 = vsubps_avx(auVar45,auVar65);
        auVar64._0_4_ = auVar59._0_4_ + auVar60._0_4_;
        auVar64._4_4_ = auVar59._4_4_ + auVar60._4_4_;
        auVar64._8_4_ = auVar59._8_4_ + auVar60._8_4_;
        auVar64._12_4_ = auVar59._12_4_ + auVar60._12_4_;
        auVar70._0_4_ = auVar65._0_4_ + fVar106;
        auVar70._4_4_ = auVar65._4_4_ + fVar107;
        auVar70._8_4_ = auVar65._8_4_ + fVar108;
        auVar70._12_4_ = auVar65._12_4_ + fVar109;
        fVar111 = local_1068._0_4_;
        auVar82._0_4_ = auVar64._0_4_ * fVar111;
        fVar113 = local_1068._4_4_;
        auVar82._4_4_ = auVar64._4_4_ * fVar113;
        fVar116 = local_1068._8_4_;
        auVar82._8_4_ = auVar64._8_4_ * fVar116;
        fVar118 = local_1068._12_4_;
        auVar82._12_4_ = auVar64._12_4_ * fVar118;
        auVar75 = vfmsub231ps_fma(auVar82,local_1048,auVar70);
        local_1058 = vsubps_avx(auVar44,auVar54);
        fVar128 = local_1058._0_4_;
        auVar90._0_4_ = fVar128 * auVar70._0_4_;
        fVar131 = local_1058._4_4_;
        auVar90._4_4_ = fVar131 * auVar70._4_4_;
        fVar133 = local_1058._8_4_;
        auVar90._8_4_ = fVar133 * auVar70._8_4_;
        fVar135 = local_1058._12_4_;
        auVar90._12_4_ = fVar135 * auVar70._12_4_;
        auVar71._0_4_ = auVar44._0_4_ + auVar54._0_4_;
        auVar71._4_4_ = auVar44._4_4_ + auVar54._4_4_;
        auVar71._8_4_ = auVar44._8_4_ + auVar54._8_4_;
        auVar71._12_4_ = auVar44._12_4_ + auVar54._12_4_;
        auVar45 = vfmsub231ps_fma(auVar90,local_1068,auVar71);
        fVar112 = local_1048._0_4_;
        auVar72._0_4_ = auVar71._0_4_ * fVar112;
        fVar114 = local_1048._4_4_;
        auVar72._4_4_ = auVar71._4_4_ * fVar114;
        fVar117 = local_1048._8_4_;
        auVar72._8_4_ = auVar71._8_4_ * fVar117;
        fVar119 = local_1048._12_4_;
        auVar72._12_4_ = auVar71._12_4_ * fVar119;
        auVar64 = vfmsub231ps_fma(auVar72,local_1058,auVar64);
        auVar73._0_4_ = fVar104 * auVar64._0_4_;
        auVar73._4_4_ = fVar104 * auVar64._4_4_;
        auVar73._8_4_ = fVar104 * auVar64._8_4_;
        auVar73._12_4_ = fVar104 * auVar64._12_4_;
        auVar45 = vfmadd231ps_fma(auVar73,auVar99,auVar45);
        auVar64 = vfmadd231ps_fma(auVar45,auVar123,auVar75);
        auVar75 = vsubps_avx(auVar54,auVar66);
        auVar83._0_4_ = auVar66._0_4_ + auVar54._0_4_;
        auVar83._4_4_ = auVar66._4_4_ + auVar54._4_4_;
        auVar83._8_4_ = auVar66._8_4_ + auVar54._8_4_;
        auVar83._12_4_ = auVar66._12_4_ + auVar54._12_4_;
        auVar66 = vsubps_avx(auVar60,auVar74);
        auVar38._0_4_ = auVar60._0_4_ + auVar74._0_4_;
        auVar38._4_4_ = auVar60._4_4_ + auVar74._4_4_;
        auVar38._8_4_ = auVar60._8_4_ + auVar74._8_4_;
        auVar38._12_4_ = auVar60._12_4_ + auVar74._12_4_;
        auVar60 = vsubps_avx(auVar65,auVar55);
        auVar47._0_4_ = auVar65._0_4_ + auVar55._0_4_;
        auVar47._4_4_ = auVar65._4_4_ + auVar55._4_4_;
        auVar47._8_4_ = auVar65._8_4_ + auVar55._8_4_;
        auVar47._12_4_ = auVar65._12_4_ + auVar55._12_4_;
        auVar91._0_4_ = auVar38._0_4_ * auVar60._0_4_;
        auVar91._4_4_ = auVar38._4_4_ * auVar60._4_4_;
        auVar91._8_4_ = auVar38._8_4_ * auVar60._8_4_;
        auVar91._12_4_ = auVar38._12_4_ * auVar60._12_4_;
        auVar54 = vfmsub231ps_fma(auVar91,auVar66,auVar47);
        auVar48._0_4_ = auVar47._0_4_ * auVar75._0_4_;
        auVar48._4_4_ = auVar47._4_4_ * auVar75._4_4_;
        auVar48._8_4_ = auVar47._8_4_ * auVar75._8_4_;
        auVar48._12_4_ = auVar47._12_4_ * auVar75._12_4_;
        auVar45 = vfmsub231ps_fma(auVar48,auVar60,auVar83);
        auVar84._0_4_ = auVar66._0_4_ * auVar83._0_4_;
        auVar84._4_4_ = auVar66._4_4_ * auVar83._4_4_;
        auVar84._8_4_ = auVar66._8_4_ * auVar83._8_4_;
        auVar84._12_4_ = auVar66._12_4_ * auVar83._12_4_;
        auVar65 = vfmsub231ps_fma(auVar84,auVar75,auVar38);
        auVar85._0_4_ = fVar104 * auVar65._0_4_;
        auVar85._4_4_ = fVar104 * auVar65._4_4_;
        auVar85._8_4_ = fVar104 * auVar65._8_4_;
        auVar85._12_4_ = fVar104 * auVar65._12_4_;
        auVar45 = vfmadd231ps_fma(auVar85,auVar99,auVar45);
        auVar65 = vfmadd231ps_fma(auVar45,auVar123,auVar54);
        auVar110._0_4_ = auVar65._0_4_ + local_1078.v[0] + auVar64._0_4_;
        auVar110._4_4_ = auVar65._4_4_ + local_1078.v[1] + auVar64._4_4_;
        auVar110._8_4_ = auVar65._8_4_ + local_1078.v[2] + auVar64._8_4_;
        auVar110._12_4_ = auVar65._12_4_ + local_1078.v[3] + auVar64._12_4_;
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar45 = vminps_avx((undefined1  [16])local_1078,auVar64);
        auVar45 = vminps_avx(auVar45,auVar65);
        local_1088 = vandps_avx(auVar110,auVar129);
        auVar100._0_4_ = local_1088._0_4_ * 1.1920929e-07;
        auVar100._4_4_ = local_1088._4_4_ * 1.1920929e-07;
        auVar100._8_4_ = local_1088._8_4_ * 1.1920929e-07;
        auVar100._12_4_ = local_1088._12_4_ * 1.1920929e-07;
        uVar18 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
        auVar92._0_8_ = uVar18 ^ 0x8000000080000000;
        auVar92._8_4_ = -auVar100._8_4_;
        auVar92._12_4_ = -auVar100._12_4_;
        auVar45 = vcmpps_avx(auVar45,auVar92,5);
        auVar54 = vmaxps_avx((undefined1  [16])local_1078,auVar64);
        auVar54 = vmaxps_avx(auVar54,auVar65);
        auVar54 = vcmpps_avx(auVar54,auVar100,2);
        auVar45 = vorps_avx(auVar45,auVar54);
        if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar45[0xf] < '\0') {
          auVar49._0_4_ = fVar112 * local_1028._0_4_;
          auVar49._4_4_ = fVar114 * local_1028._4_4_;
          auVar49._8_4_ = fVar117 * local_1028._8_4_;
          auVar49._12_4_ = fVar119 * local_1028._12_4_;
          auVar86._0_4_ = fVar128 * local_1038._0_4_;
          auVar86._4_4_ = fVar131 * local_1038._4_4_;
          auVar86._8_4_ = fVar133 * local_1038._8_4_;
          auVar86._12_4_ = fVar135 * local_1038._12_4_;
          auVar65 = vfmsub213ps_fma(local_1038,local_1068,auVar49);
          auVar93._0_4_ = auVar66._0_4_ * fVar111;
          auVar93._4_4_ = auVar66._4_4_ * fVar113;
          auVar93._8_4_ = auVar66._8_4_ * fVar116;
          auVar93._12_4_ = auVar66._12_4_ * fVar118;
          auVar101._0_4_ = fVar128 * auVar60._0_4_;
          auVar101._4_4_ = fVar131 * auVar60._4_4_;
          auVar101._8_4_ = fVar133 * auVar60._8_4_;
          auVar101._12_4_ = fVar135 * auVar60._12_4_;
          auVar74 = vfmsub213ps_fma(auVar60,local_1048,auVar93);
          auVar54 = vandps_avx(auVar129,auVar49);
          auVar60 = vandps_avx(auVar129,auVar93);
          auVar54 = vcmpps_avx(auVar54,auVar60,1);
          local_1148 = vblendvps_avx(auVar74,auVar65,auVar54);
          auVar77._0_4_ = fVar112 * auVar75._0_4_;
          auVar77._4_4_ = fVar114 * auVar75._4_4_;
          auVar77._8_4_ = fVar117 * auVar75._8_4_;
          auVar77._12_4_ = fVar119 * auVar75._12_4_;
          auVar65 = vfmsub213ps_fma(auVar75,local_1068,auVar101);
          auVar94._0_4_ = auVar61._0_4_ * fVar111;
          auVar94._4_4_ = auVar61._4_4_ * fVar113;
          auVar94._8_4_ = auVar61._8_4_ * fVar116;
          auVar94._12_4_ = auVar61._12_4_ * fVar118;
          auVar74 = vfmsub213ps_fma(local_1028,local_1058,auVar94);
          auVar54 = vandps_avx(auVar129,auVar94);
          auVar60 = vandps_avx(auVar101,auVar129);
          auVar54 = vcmpps_avx(auVar54,auVar60,1);
          local_1138 = vblendvps_avx(auVar65,auVar74,auVar54);
          auVar65 = vfmsub213ps_fma(auVar61,local_1048,auVar86);
          auVar66 = vfmsub213ps_fma(auVar66,local_1058,auVar77);
          auVar54 = vandps_avx(auVar129,auVar86);
          auVar60 = vandps_avx(auVar129,auVar77);
          auVar54 = vcmpps_avx(auVar54,auVar60,1);
          local_1128 = vblendvps_avx(auVar66,auVar65,auVar54);
          auVar78._0_4_ = local_1128._0_4_ * fVar104;
          auVar78._4_4_ = local_1128._4_4_ * fVar104;
          auVar78._8_4_ = local_1128._8_4_ * fVar104;
          auVar78._12_4_ = local_1128._12_4_ * fVar104;
          auVar54 = vfmadd213ps_fma(auVar99,local_1138,auVar78);
          auVar54 = vfmadd213ps_fma(auVar123,local_1148,auVar54);
          auVar79._0_4_ = auVar54._0_4_ + auVar54._0_4_;
          auVar79._4_4_ = auVar54._4_4_ + auVar54._4_4_;
          auVar79._8_4_ = auVar54._8_4_ + auVar54._8_4_;
          auVar79._12_4_ = auVar54._12_4_ + auVar54._12_4_;
          auVar87._0_4_ = local_1128._0_4_ * fVar106;
          auVar87._4_4_ = local_1128._4_4_ * fVar107;
          auVar87._8_4_ = local_1128._8_4_ * fVar108;
          auVar87._12_4_ = local_1128._12_4_ * fVar109;
          auVar54 = vfmadd213ps_fma(auVar59,local_1138,auVar87);
          auVar44 = vfmadd213ps_fma(auVar44,local_1148,auVar54);
          auVar54 = vrcpps_avx(auVar79);
          auVar102._8_4_ = 0x3f800000;
          auVar102._0_8_ = &DAT_3f8000003f800000;
          auVar102._12_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_fma(auVar54,auVar79,auVar102);
          auVar54 = vfmadd132ps_fma(auVar59,auVar54,auVar54);
          local_1158._0_4_ = auVar54._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
          local_1158._4_4_ = auVar54._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
          local_1158._8_4_ = auVar54._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
          local_1158._12_4_ = auVar54._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
          auVar43 = ZEXT1664(local_1158);
          uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x30);
          auVar88._4_4_ = uVar28;
          auVar88._0_4_ = uVar28;
          auVar88._8_4_ = uVar28;
          auVar88._12_4_ = uVar28;
          auVar54 = vcmpps_avx(auVar88,local_1158,2);
          uVar28 = *(undefined4 *)(local_1238 + k * 4 + 0x80);
          auVar95._4_4_ = uVar28;
          auVar95._0_4_ = uVar28;
          auVar95._8_4_ = uVar28;
          auVar95._12_4_ = uVar28;
          auVar44 = vcmpps_avx(local_1158,auVar95,2);
          auVar54 = vandps_avx(auVar54,auVar44);
          auVar59 = auVar45 & auVar54;
          if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar59[0xf] < '\0') {
            auVar45 = vandps_avx(auVar54,auVar45);
            auVar54 = vcmpps_avx(auVar79,_DAT_01feba10,4);
            auVar59 = auVar54 & auVar45;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar45,auVar54);
              tNear.field_0 = local_1078;
              auVar45 = vrcpps_avx(auVar110);
              auVar58._8_4_ = 0x3f800000;
              auVar58._0_8_ = &DAT_3f8000003f800000;
              auVar58._12_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(auVar110,auVar45,auVar58);
              auVar54 = vfmadd132ps_fma(auVar54,auVar45,auVar45);
              auVar50._8_4_ = 0x219392ef;
              auVar50._0_8_ = 0x219392ef219392ef;
              auVar50._12_4_ = 0x219392ef;
              auVar45 = vcmpps_avx(local_1088,auVar50,5);
              auVar45 = vandps_avx(auVar54,auVar45);
              auVar39._0_4_ = local_1078.v[0] * auVar45._0_4_;
              auVar39._4_4_ = local_1078.v[1] * auVar45._4_4_;
              auVar39._8_4_ = local_1078.v[2] * auVar45._8_4_;
              auVar39._12_4_ = local_1078.v[3] * auVar45._12_4_;
              local_1178 = vminps_avx(auVar39,auVar58);
              auVar40._0_4_ = auVar45._0_4_ * auVar64._0_4_;
              auVar40._4_4_ = auVar45._4_4_ * auVar64._4_4_;
              auVar40._8_4_ = auVar45._8_4_ * auVar64._8_4_;
              auVar40._12_4_ = auVar45._12_4_ * auVar64._12_4_;
              local_1168 = vminps_avx(auVar40,auVar58);
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar45 = vblendvps_avx(auVar51,local_1158,(undefined1  [16])valid.field_0);
              auVar54 = vshufps_avx(auVar45,auVar45,0xb1);
              auVar54 = vminps_avx(auVar54,auVar45);
              auVar59 = vshufpd_avx(auVar54,auVar54,1);
              auVar54 = vminps_avx(auVar59,auVar54);
              auVar54 = vcmpps_avx(auVar45,auVar54,0);
              auVar59 = (undefined1  [16])valid.field_0 & auVar54;
              auVar45 = vpcmpeqd_avx(auVar45,auVar45);
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar45 = auVar54;
              }
              auVar45 = vandps_avx((undefined1  [16])valid.field_0,auVar45);
              auVar54 = vpcmpeqd_avx(auVar44,auVar44);
              auVar96 = ZEXT1664(auVar54);
              scene = pSVar5;
              do {
                auVar45 = vpslld_avx(auVar45,0x1f);
                uVar28 = vmovmskps_avx(auVar45);
                lVar10 = 0;
                for (uVar18 = CONCAT44((int)((ulong)pUVar19 >> 0x20),uVar28); (uVar18 & 1) == 0;
                    uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar10 = lVar10 + 1;
                }
                uVar4 = *(uint *)((long)&local_1018 + lVar10 * 4);
                pUVar19 = (UVIdentity<4> *)(ulong)uVar4;
                pGVar6 = (pSVar5->geometries).items[(long)pUVar19].ptr;
                if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar10] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar18 = (ulong)(uint)((int)lVar10 << 2);
                    uVar28 = *(undefined4 *)(local_1178 + uVar18);
                    uVar2 = *(undefined4 *)(local_1168 + uVar18);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar18);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1148 + uVar18);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1138 + uVar18);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1128 + uVar18);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_11d8 + uVar18);
                    *(uint *)(ray + k * 4 + 0x120) = uVar4;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar18 = (ulong)(uint)((int)lVar10 * 4);
                  uVar28 = *(undefined4 *)(local_1178 + uVar18);
                  local_fd8._4_4_ = uVar28;
                  local_fd8._0_4_ = uVar28;
                  local_fd8._8_4_ = uVar28;
                  local_fd8._12_4_ = uVar28;
                  local_fc8 = *(undefined4 *)(local_1168 + uVar18);
                  local_fa8._4_4_ = uVar4;
                  local_fa8._0_4_ = uVar4;
                  local_fa8._8_4_ = uVar4;
                  local_fa8._12_4_ = uVar4;
                  uVar28 = *(undefined4 *)((long)&local_11d8 + uVar18);
                  local_fb8._4_4_ = uVar28;
                  local_fb8._0_4_ = uVar28;
                  local_fb8._8_4_ = uVar28;
                  local_fb8._12_4_ = uVar28;
                  uVar28 = *(undefined4 *)(local_1148 + uVar18);
                  uVar2 = *(undefined4 *)(local_1138 + uVar18);
                  local_ff8._4_4_ = uVar2;
                  local_ff8._0_4_ = uVar2;
                  local_ff8._8_4_ = uVar2;
                  local_ff8._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_1128 + uVar18);
                  local_fe8._4_4_ = uVar2;
                  local_fe8._0_4_ = uVar2;
                  local_fe8._8_4_ = uVar2;
                  local_fe8._12_4_ = uVar2;
                  local_1008[0] = (RTCHitN)(char)uVar28;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar28;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar28;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar28;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  uStack_fc4 = local_fc8;
                  uStack_fc0 = local_fc8;
                  uStack_fbc = local_fc8;
                  vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                  uStack_f94 = context->user->instID[0];
                  local_f98 = uStack_f94;
                  uStack_f90 = uStack_f94;
                  uStack_f8c = uStack_f94;
                  uStack_f88 = context->user->instPrimID[0];
                  uStack_f84 = uStack_f88;
                  uStack_f80 = uStack_f88;
                  uStack_f7c = uStack_f88;
                  uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + uVar18);
                  local_1278 = *local_1268;
                  uStack_1270 = local_1268[1];
                  args.valid = (int *)&local_1278;
                  args.geometryUserPtr = pGVar6->userPtr;
                  args.context = context->user;
                  args.ray = (RTCRayN *)ray;
                  args.hit = local_1008;
                  args.N = 4;
                  pUVar19 = (UVIdentity<4> *)pGVar6->intersectionFilterN;
                  auVar45 = auVar43._0_16_;
                  if (pUVar19 != (UVIdentity<4> *)0x0) {
                    auVar54 = auVar96._0_16_;
                    pUVar19 = (UVIdentity<4> *)(*(code *)pUVar19)(&args);
                    auVar43 = ZEXT1664(auVar45);
                    auVar54 = vpcmpeqd_avx(auVar54,auVar54);
                    auVar96 = ZEXT1664(auVar54);
                  }
                  auVar12._8_8_ = uStack_1270;
                  auVar12._0_8_ = local_1278;
                  auVar54 = auVar96._0_16_;
                  if (auVar12 == (undefined1  [16])0x0) {
                    auVar45 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar45 = auVar45 ^ auVar54;
                  }
                  else {
                    pUVar19 = (UVIdentity<4> *)context->args->filter;
                    if ((pUVar19 != (UVIdentity<4> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      pUVar19 = (UVIdentity<4> *)(*(code *)pUVar19)(&args);
                      auVar43 = ZEXT1664(auVar45);
                      auVar45 = vpcmpeqd_avx(auVar54,auVar54);
                      auVar96 = ZEXT1664(auVar45);
                    }
                    auVar13._8_8_ = uStack_1270;
                    auVar13._0_8_ = local_1278;
                    auVar54 = vpcmpeqd_avx(auVar13,_DAT_01feba10);
                    auVar45 = auVar54 ^ auVar96._0_16_;
                    if (auVar13 != (undefined1  [16])0x0) {
                      auVar54 = auVar54 ^ auVar96._0_16_;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])args.hit);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x10));
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x20));
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x30));
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x40));
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar44;
                      auVar44 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar44;
                      auVar54 = vmaskmovps_avx(auVar54,*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar54;
                      pUVar19 = (UVIdentity<4> *)args.ray;
                    }
                  }
                  auVar53._8_8_ = 0x100000001;
                  auVar53._0_8_ = 0x100000001;
                  if ((auVar53 & auVar45) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar28;
                  }
                  valid.field_0.v[lVar10] = 0.0;
                  uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar42._4_4_ = uVar28;
                  auVar42._0_4_ = uVar28;
                  auVar42._8_4_ = uVar28;
                  auVar42._12_4_ = uVar28;
                  auVar45 = vcmpps_avx(auVar43._0_16_,auVar42,2);
                  valid.field_0 =
                       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                       vandps_avx(auVar45,(undefined1  [16])valid.field_0);
                }
                if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0 &&
                     ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                     (undefined1  [16])0x0) &&
                    ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar45 = vblendvps_avx(auVar52,auVar43._0_16_,(undefined1  [16])valid.field_0);
                auVar54 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar54 = vminps_avx(auVar54,auVar45);
                auVar44 = vshufpd_avx(auVar54,auVar54,1);
                auVar54 = vminps_avx(auVar44,auVar54);
                auVar45 = vcmpps_avx(auVar45,auVar54,0);
                auVar54 = (undefined1  [16])valid.field_0 & auVar45;
                aVar41 = valid.field_0;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  aVar41.v = (__m128)vandps_avx(auVar45,valid.field_0);
                }
                auVar45 = vpcmpgtd_avx(ZEXT816(0) << 0x20,(undefined1  [16])aVar41);
              } while( true );
            }
          }
        }
        local_1220 = local_1220 + 1;
        pRVar21 = ray;
      } while (local_1220 != local_1230);
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar43 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
    auVar96 = ZEXT1664(local_1098);
    auVar97 = ZEXT1664(local_10a8);
    auVar103 = ZEXT1664(local_10b8);
    uVar26 = local_1260;
    uVar18 = local_1240;
    uVar23 = local_1248;
    uVar24 = local_1250;
    uVar27 = local_1258;
    fVar104 = local_10c8;
    fVar106 = fStack_10c4;
    fVar107 = fStack_10c0;
    fVar108 = fStack_10bc;
    fVar109 = local_10d8;
    fVar111 = fStack_10d4;
    fVar112 = fStack_10d0;
    fVar113 = fStack_10cc;
    fVar114 = local_10e8;
    fVar116 = fStack_10e4;
    fVar117 = fStack_10e0;
    fVar118 = fStack_10dc;
    fVar119 = local_10f8;
    fVar128 = fStack_10f4;
    fVar131 = fStack_10f0;
    fVar133 = fStack_10ec;
    fVar135 = local_1108;
    fVar124 = fStack_1104;
    fVar125 = fStack_1100;
    fVar126 = fStack_10fc;
    fVar127 = local_1118;
    fVar130 = fStack_1114;
    fVar132 = fStack_1110;
    fVar134 = fStack_110c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }